

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O1

Optional<llvm::object::SectionedAddress> * __thiscall
llvm::DWARFUnit::getAddrOffsetSectionItem
          (Optional<llvm::object::SectionedAddress> *__return_storage_ptr__,DWARFUnit *this,
          uint32_t Index)

{
  DWARFContext *this_00;
  uint uVar1;
  uint64_t uVar2;
  DWARFDataExtractor local_58;
  ulong local_30;
  uint64_t Offset;
  
  while (this->IsDWO == true) {
    this_00 = this->Context;
    DWARFContext::parseNormalUnits(this_00);
    uVar1 = (this_00->NormalUnits).NumInfoUnits;
    if (uVar1 == 0xffffffff) {
      uVar1 = (this_00->NormalUnits).
              super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
              .
              super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
              .
              super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
              .
              super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
              .super_SmallVectorBase.Size;
    }
    if (uVar1 != 1) break;
    this = *(this_00->NormalUnits).
            super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
            .
            super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
            .
            super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
            .
            super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
            .super_SmallVectorBase.BeginX;
  }
  local_58.super_DataExtractor.AddressSize = (this->Header).FormParams.AddrSize;
  local_30 = (ulong)(Index * local_58.super_DataExtractor.AddressSize + this->AddrOffsetSectionBase)
  ;
  local_58.Section = this->AddrOffsetSection;
  if (((local_58.Section)->Data).Length < local_30 + local_58.super_DataExtractor.AddressSize) {
    (__return_storage_ptr__->Storage).field_0.empty = '\0';
    (__return_storage_ptr__->Storage).hasVal = false;
  }
  else {
    local_58.Obj = (this->Context->DObj)._M_t.
                   super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                   .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
    local_58.super_DataExtractor.IsLittleEndian = this->isLittleEndian;
    local_58.super_DataExtractor.Data.Data = ((local_58.Section)->Data).Data;
    local_58.super_DataExtractor.Data.Length = ((local_58.Section)->Data).Length;
    uVar2 = DWARFDataExtractor::getRelocatedValue
                      (&local_58,(uint)local_58.super_DataExtractor.AddressSize,&local_30,
                       &(__return_storage_ptr__->Storage).field_0.value.SectionIndex,(Error *)0x0);
    (__return_storage_ptr__->Storage).field_0.value.Address = uVar2;
    (__return_storage_ptr__->Storage).hasVal = true;
  }
  return __return_storage_ptr__;
}

Assistant:

Optional<object::SectionedAddress>
DWARFUnit::getAddrOffsetSectionItem(uint32_t Index) const {
  if (IsDWO) {
    auto R = Context.info_section_units();
    auto I = R.begin();
    // Surprising if a DWO file has more than one skeleton unit in it - this
    // probably shouldn't be valid, but if a use case is found, here's where to
    // support it (probably have to linearly search for the matching skeleton CU
    // here)
    if (I != R.end() && std::next(I) == R.end())
      return (*I)->getAddrOffsetSectionItem(Index);
  }
  uint64_t Offset = AddrOffsetSectionBase + Index * getAddressByteSize();
  if (AddrOffsetSection->Data.size() < Offset + getAddressByteSize())
    return None;
  DWARFDataExtractor DA(Context.getDWARFObj(), *AddrOffsetSection,
                        isLittleEndian, getAddressByteSize());
  uint64_t Section;
  uint64_t Address = DA.getRelocatedAddress(&Offset, &Section);
  return {{Address, Section}};
}